

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

char * google::protobuf::io::FetchUnicodePoint(char *ptr,uint32_t *code_point)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t local_30;
  int local_2c;
  uint32_t trail_surrogate;
  int len;
  char *p;
  uint32_t *code_point_local;
  char *ptr_local;
  
  _trail_surrogate = ptr + 1;
  p = (char *)code_point;
  code_point_local = (uint32_t *)ptr;
  local_2c = UnicodeLength(*ptr);
  bVar1 = ReadHexDigits(_trail_surrogate,local_2c,(uint32_t *)p);
  if (bVar1) {
    _trail_surrogate = _trail_surrogate + local_2c;
    bVar1 = IsHeadSurrogate(*(uint32_t *)p);
    if ((((bVar1) && (*_trail_surrogate == '\\')) && (_trail_surrogate[1] == 'u')) &&
       ((bVar1 = ReadHexDigits(_trail_surrogate + 2,4,&local_30), bVar1 &&
        (bVar1 = IsTrailSurrogate(local_30), bVar1)))) {
      uVar2 = AssembleUTF16(*(uint32_t *)p,local_30);
      *(uint32_t *)p = uVar2;
      _trail_surrogate = _trail_surrogate + 6;
    }
    ptr_local = _trail_surrogate;
  }
  else {
    ptr_local = (char *)code_point_local;
  }
  return ptr_local;
}

Assistant:

static const char* FetchUnicodePoint(const char* ptr, uint32_t* code_point) {
  const char* p = ptr;
  // Fetch the code point.
  const int len = UnicodeLength(*p++);
  if (!ReadHexDigits(p, len, code_point)) return ptr;
  p += len;

  // Check if the code point we read is a "head surrogate." If so, then we
  // expect it to be immediately followed by another code point which is a valid
  // "trail surrogate," and together they form a UTF-16 pair which decodes into
  // a single Unicode point. Trail surrogates may only use \u, not \U.
  if (IsHeadSurrogate(*code_point) && *p == '\\' && *(p + 1) == 'u') {
    uint32_t trail_surrogate;
    if (ReadHexDigits(p + 2, 4, &trail_surrogate) &&
        IsTrailSurrogate(trail_surrogate)) {
      *code_point = AssembleUTF16(*code_point, trail_surrogate);
      p += 6;
    }
    // If this failed, then we just emit the head surrogate as a code point.
    // It's bogus, but so is the string.
  }

  return p;
}